

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.cc
# Opt level: O1

int main(int argc,char **argv)

{
  KVStore *this;
  int iVar1;
  ostream *poVar2;
  char *mode;
  char *verb;
  bool bVar3;
  bool testmode;
  PersistenceTest test;
  char local_db;
  allocator<char> local_da;
  allocator<char> local_d9;
  PersistenceTest local_d8;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  local_db = '\0';
  if (argc == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,argv[1],(allocator<char> *)local_50);
    iVar1 = std::__cxx11::string::compare((char *)&local_d8);
    if (iVar1 == 0) {
      bVar3 = true;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_70,argv[2],&local_d9);
      iVar1 = std::__cxx11::string::compare((char *)local_70);
      bVar3 = iVar1 == 0;
      if (local_70[0] != local_60) {
        operator_delete(local_70[0],local_60[0] + 1);
      }
    }
    if (local_d8.super_Test._vptr_Test != (_func_int **)&local_d8.super_Test.nr_passed_tests) {
      operator_delete(local_d8.super_Test._vptr_Test,local_d8.super_Test.nr_passed_tests + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,argv[1],(allocator<char> *)&local_90);
    iVar1 = std::__cxx11::string::compare((char *)&local_d8);
    if (iVar1 == 0) {
      local_db = '\x01';
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,argv[2],&local_da);
      iVar1 = std::__cxx11::string::compare((char *)local_50);
      local_db = iVar1 == 0;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
  }
  else {
    if (argc != 2) {
      if (3 < argc) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Too many arguments.");
        std::endl<char,std::char_traits<char>>(poVar2);
        usage(*argv,"OFF","Preparation Mode");
        exit(-1);
      }
      bVar3 = false;
      goto LAB_00103ece;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,argv[1],(allocator<char> *)local_70);
    iVar1 = std::__cxx11::string::compare((char *)&local_d8);
    bVar3 = iVar1 == 0;
    if (local_d8.super_Test._vptr_Test != (_func_int **)&local_d8.super_Test.nr_passed_tests) {
      operator_delete(local_d8.super_Test._vptr_Test,local_d8.super_Test.nr_passed_tests + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,argv[1],(allocator<char> *)local_70);
    iVar1 = std::__cxx11::string::compare((char *)&local_d8);
    local_db = iVar1 == 0;
  }
  if (local_d8.super_Test._vptr_Test != (_func_int **)&local_d8.super_Test.nr_passed_tests) {
    operator_delete(local_d8.super_Test._vptr_Test,local_d8.super_Test.nr_passed_tests + 1);
  }
LAB_00103ece:
  verb = "OFF";
  if (bVar3 != false) {
    verb = "ON";
  }
  mode = "Preparation Mode";
  if (local_db != '\0') {
    mode = "Test Mode";
  }
  usage(*argv,verb,mode);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"./data","");
  this = &local_d8.super_Test.store;
  local_d8.super_Test._vptr_Test = (_func_int **)&PTR_start_test_00110c18;
  KVStore::KVStore(this,&local_90);
  local_d8.super_Test.nr_tests = 0;
  local_d8.super_Test.nr_passed_tests = 0;
  local_d8.super_Test.nr_phases = 0;
  local_d8.super_Test.nr_passed_phases = 0;
  local_d8.super_Test._vptr_Test = (_func_int **)&PTR_start_test_00110bd8;
  local_d8.TEST_MAX = 0x8000;
  local_d8.super_Test.verbose = bVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  PersistenceTest::start_test(&local_d8,&local_db);
  local_d8.super_Test._vptr_Test = (_func_int **)&PTR_start_test_00110c18;
  KVStore::~KVStore(this);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    bool verbose = false;
    bool testmode = false;

    if (argc == 2) {
        verbose = std::string(argv[1]) == "-v";
        testmode = std::string(argv[1]) == "-t";
    } else if (argc == 3) {
        verbose = std::string(argv[1]) == "-v" ||
                  std::string(argv[2]) == "-v";
        testmode = std::string(argv[1]) == "-t" ||
                   std::string(argv[2]) == "-t";
    } else if (argc > 3) {
        std::cerr << "Too many arguments." << std::endl;
        usage(argv[0], "OFF", "Preparation Mode");
        exit(-1);
    }
    usage(argv[0], verbose ? "ON" : "OFF",
          testmode ? "Test Mode" : "Preparation Mode");

    PersistenceTest test("./data", verbose);

    test.start_test(static_cast<void *>(&testmode));

    return 0;
}